

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O0

int trie_insert(trie t,vector keys,trie_value value)

{
  size_t sVar1;
  void *key;
  set_value pvVar2;
  trie_value in_RDX;
  vector in_RSI;
  trie_node in_RDI;
  trie_node_ref node_ref;
  trie_node next_node;
  trie_key *key_ptr;
  trie_node current_node;
  size_t size;
  size_t iterator;
  undefined7 in_stack_ffffffffffffffa8;
  set local_48;
  set s;
  ulong local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  if (in_RDI == (trie_node)0x0) {
    iVar3 = 1;
  }
  else {
    sVar1 = vector_size(in_RSI);
    s = (set)in_RDI->parent_index;
    for (local_28 = 0; s != (set)0x0 && local_28 < sVar1; local_28 = local_28 + 1) {
      key = vector_at((vector)CONCAT17(s != (set)0x0 && local_28 < sVar1,in_stack_ffffffffffffffa8),
                      0x11d1df);
      local_48 = (set)0x0;
      if ((s->hash_cb != (set_cb_hash)0x0) && (pvVar2 = set_get(s,key), pvVar2 != (set_value)0x0)) {
        local_48 = (set)(in_RDI->self_index + *(long *)((long)pvVar2 + 8) * 0x28);
      }
      if (local_48 == (set)0x0) {
        if (local_28 == sVar1 - 1) {
          local_48 = (set)trie_node_insert((trie)CONCAT44(in_stack_fffffffffffffffc,
                                                          in_stack_fffffffffffffff8),in_RDI,in_RSI,
                                           in_RDX);
        }
        else {
          local_48 = (set)trie_node_insert((trie)CONCAT44(in_stack_fffffffffffffffc,
                                                          in_stack_fffffffffffffff8),in_RDI,in_RSI,
                                           in_RDX);
        }
        if (local_48 == (set)0x0) {
          log_write_impl_va("metacall",0x17b,"trie_insert",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                            ,LOG_LEVEL_ERROR,"Trie invalid node insertion");
          return 1;
        }
      }
      s = local_48;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int trie_insert(trie t, vector keys, trie_value value)
{
	if (t != NULL)
	{
		size_t iterator, size = vector_size(keys);

		trie_node current_node = t->root;

		for (iterator = 0; current_node != NULL && iterator < size; ++iterator)
		{
			trie_key *key_ptr = vector_at(keys, iterator);

			trie_node next_node = NULL;

			if (current_node->childs != NULL)
			{
				trie_node_ref node_ref = set_get(current_node->childs, *key_ptr);

				if (node_ref != NULL)
				{
					next_node = &t->node_list[node_ref->index];
				}
			}

			if (next_node == NULL)
			{
				if (iterator == (size - 1))
				{
					next_node = trie_node_insert(t, current_node, *key_ptr, value);
				}
				else
				{
					next_node = trie_node_insert(t, current_node, *key_ptr, NULL);
				}

				if (next_node == NULL)
				{
					log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid node insertion");

					return 1;
				}
			}

			current_node = next_node;
		}

		return 0;
	}

	return 1;
}